

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_scale_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3010dc::ResizeAndExtendTest::RunTest
          (ResizeAndExtendTest *this,InterpFilter filter_type)

{
  uint src_height;
  uint src_width;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  bool bVar6;
  bool bVar7;
  pointer *__ptr;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  SEARCH_METHODS *pSVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int dst_width;
  int dst_height;
  int in_stack_ffffffffffffff28;
  undefined4 uStack_d4;
  uint local_cc;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_a0;
  int local_98;
  int local_94;
  int local_90;
  uint local_8c;
  ulong local_88;
  YV12_BUFFER_CONFIG *local_80;
  YV12_BUFFER_CONFIG *local_78;
  YV12_BUFFER_CONFIG *local_70;
  long local_68;
  long local_60;
  size_t *local_58;
  size_t *local_50;
  ResizeAndExtendTest *local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = &this->img_;
  local_78 = &this->ref_img_;
  local_80 = &this->dst_img_;
  local_50 = &(this->ref_img_).frame_size;
  local_58 = &(this->dst_img_).frame_size;
  bVar6 = true;
  lVar14 = 0;
  local_48 = this;
  do {
    local_98 = RunTest::kDstBorders[lVar14];
    local_cc = 0;
    do {
      local_68 = 0;
      do {
        src_height = RunTest::kSizesToTest[local_68];
        local_60 = 0;
        do {
          src_width = RunTest::kSizesToTest[local_60];
          uVar8 = 0;
          do {
            uVar1 = RunTest::kScaleFactors[uVar8];
            uVar9 = (ulong)uVar1;
            iVar11 = uVar1 * src_width;
            iVar12 = uVar1 * src_height;
            uVar13 = uVar8 ^ 2;
            lVar14 = 0;
            local_94 = iVar12;
            local_90 = iVar11;
            local_88 = uVar9;
            local_40 = uVar13;
            local_38 = uVar8;
            do {
              uVar1 = *(uint *)((long)RunTest::kScaleFactors + lVar14);
              uVar2 = (long)iVar11 / (long)(int)uVar1;
              uVar3 = (long)iVar12 / (long)(int)uVar1;
              if (((((lVar14 != 0xc || uVar13 != 0) && (uVar8 == 0 || (uint)uVar9 != uVar1)) &&
                   ((uVar2 & 1) == 0)) &&
                  ((dst_width = (int)uVar2, dst_width != 0 &&
                   (dst_height = (int)uVar3, dst_height != 0)))) &&
                 (((uVar3 & 1) == 0 &&
                  ((src_width == dst_width * 4 ||
                    SBORROW4(src_width,dst_width * 4) != (int)(src_width + dst_width * -4) < 0 &&
                   (src_height == dst_height * 4 ||
                    SBORROW4(src_height,dst_height * 4) != (int)(src_height + dst_height * -4) < 0))
                  )))) {
                bVar7 = testing::internal::AlwaysTrue();
                if (!bVar7) {
LAB_00447473:
                  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x85,
                             "Expected: ResetResizeImages( src_width, src_height, dst_width, dst_height, dst_border) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                            );
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xffffffffffffff28,
                             (Message *)&gtest_fatal_failure_checker);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff28);
                  if ((long *)CONCAT71(gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface._1_7_,
                                       (char)gtest_fatal_failure_checker.
                                             super_TestPartResultReporterInterface.
                                             _vptr_TestPartResultReporterInterface) == (long *)0x0)
                  {
                    return;
                  }
                  (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.
                                                 super_TestPartResultReporterInterface.
                                                 _vptr_TestPartResultReporterInterface._1_7_,
                                                 (char)gtest_fatal_failure_checker.
                                                       super_TestPartResultReporterInterface.
                                                       _vptr_TestPartResultReporterInterface) + 8))
                            ();
                  return;
                }
                testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                          (&gtest_fatal_failure_checker);
                bVar7 = testing::internal::AlwaysTrue();
                if (bVar7) {
                  ResetResizeImages(this,src_width,src_height,dst_width,dst_height,local_98);
                }
                bVar7 = gtest_fatal_failure_checker.has_new_fatal_failure_;
                testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                          (&gtest_fatal_failure_checker);
                pYVar5 = local_70;
                if (bVar7 == true) goto LAB_00447473;
                local_8c = (uint)CONCAT71(in_register_00000031,filter_type) & 0xff;
                av1_resize_and_extend_frame_c(local_70,local_78,filter_type,local_cc,1);
                this = local_48;
                (*local_48->resize_fn_)(pYVar5,local_80,(InterpFilter)local_8c,local_cc,1);
                iVar11 = bcmp((this->dst_img_).buffer_alloc,(this->ref_img_).buffer_alloc,
                              (this->ref_img_).frame_size);
                if (iVar11 != 0) {
                  printf("filter_type = %d, phase_scaler = %d, src_width = %4d, src_height = %4d, dst_width = %4d, dst_height = %4d, scale factor = %d:%d\n"
                         ,CONCAT71(in_register_00000031,filter_type) & 0xffffffff,(ulong)local_cc,
                         (ulong)src_width,(ulong)src_height,uVar2 & 0xffffffff,uVar3 & 0xffffffff,
                         (ulong)uVar1,local_88);
                  iVar11 = bcmp((this->dst_img_).buffer_alloc,(this->ref_img_).buffer_alloc,
                                (this->ref_img_).frame_size);
                  if (iVar11 != 0) {
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.y_buffer,
                                       (this->dst_img_).field_5.field_0.y_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.y_stride,
                                       (this->ref_img_).field_0.field_0.y_width,
                                       (this->ref_img_).field_1.field_0.y_height,0,
                                       in_stack_ffffffffffffff28);
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.u_buffer,
                                       (this->dst_img_).field_5.field_0.u_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.uv_stride,
                                       (this->ref_img_).field_0.field_0.uv_width,
                                       (this->ref_img_).field_1.field_0.uv_height,1,
                                       in_stack_ffffffffffffff28);
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.v_buffer,
                                       (this->dst_img_).field_5.field_0.v_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.uv_stride,
                                       (this->ref_img_).field_0.field_0.uv_width,
                                       (this->ref_img_).field_1.field_0.uv_height,2,
                                       in_stack_ffffffffffffff28);
                  }
                }
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)&gtest_fatal_failure_checker,"ref_img_.frame_size",
                           "dst_img_.frame_size",local_50,local_58);
                if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                          _vptr_TestPartResultReporterInterface == '\0') {
                  testing::Message::Message((Message *)&stack0xffffffffffffff28);
                  pSVar10 = "";
                  if ((undefined8 *)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_) !=
                      (undefined8 *)0x0) {
                    pSVar10 = *(SEARCH_METHODS **)
                               CONCAT71(gtest_fatal_failure_checker._9_7_,
                                        gtest_fatal_failure_checker.has_new_fatal_failure_);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x96,(char *)pSVar10);
                  testing::internal::AssertHelper::operator=
                            (&local_a0,(Message *)&stack0xffffffffffffff28);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  if ((long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) + 8))();
                  }
                }
                puVar4 = (undefined8 *)
                         CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
                if (puVar4 != (undefined8 *)0x0) {
                  if ((undefined8 *)*puVar4 != puVar4 + 2) {
                    operator_delete((undefined8 *)*puVar4);
                  }
                  operator_delete(puVar4);
                }
                in_stack_ffffffffffffff28 = 0;
                local_a0.data_._0_4_ =
                     memcmp((this->ref_img_).buffer_alloc,(this->dst_img_).buffer_alloc,
                            (this->ref_img_).frame_size);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_fatal_failure_checker,"0",
                           "memcmp(ref_img_.buffer_alloc, dst_img_.buffer_alloc, ref_img_.frame_size)"
                           ,(int *)&stack0xffffffffffffff28,(int *)&local_a0);
                if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                          _vptr_TestPartResultReporterInterface == '\0') {
                  testing::Message::Message((Message *)&stack0xffffffffffffff28);
                  pSVar10 = "";
                  if ((undefined8 *)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_) !=
                      (undefined8 *)0x0) {
                    pSVar10 = *(SEARCH_METHODS **)
                               CONCAT71(gtest_fatal_failure_checker._9_7_,
                                        gtest_fatal_failure_checker.has_new_fatal_failure_);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x99,(char *)pSVar10);
                  testing::internal::AssertHelper::operator=
                            (&local_a0,(Message *)&stack0xffffffffffffff28);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  if ((long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) + 8))();
                  }
                }
                puVar4 = (undefined8 *)
                         CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
                if (puVar4 != (undefined8 *)0x0) {
                  if ((undefined8 *)*puVar4 != puVar4 + 2) {
                    operator_delete((undefined8 *)*puVar4);
                  }
                  operator_delete(puVar4);
                }
                aom_free_frame_buffer(local_70);
                aom_free_frame_buffer(local_78);
                aom_free_frame_buffer(local_80);
                uVar8 = local_38;
                uVar9 = local_88;
                uVar13 = local_40;
                iVar11 = local_90;
                iVar12 = local_94;
              }
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x10);
            uVar8 = uVar8 + 1;
          } while (uVar8 != 4);
          local_60 = local_60 + 1;
        } while (local_60 != 0x16);
        local_68 = local_68 + 1;
      } while (local_68 != 0x16);
      local_cc = local_cc + 1;
    } while (local_cc != 0x10);
    lVar14 = 1;
    bVar7 = !bVar6;
    bVar6 = false;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void RunTest(InterpFilter filter_type) {
    static const int kNumSizesToTest = 22;
    static const int kNumScaleFactorsToTest = 4;
    static const int kNumDstBordersToTest = 2;
    static const int kSizesToTest[] = { 1,  2,  3,  4,  6,   8,  10, 12,
                                        14, 16, 18, 20, 22,  24, 26, 28,
                                        30, 32, 34, 68, 128, 134 };
    static const int kScaleFactors[] = { 1, 2, 3, 4 };
    static const int kDstBorders[] = { 0, AOM_BORDER_IN_PIXELS };
    for (int border = 0; border < kNumDstBordersToTest; ++border) {
      const int dst_border = kDstBorders[border];
      for (int phase_scaler = 0; phase_scaler < 16; ++phase_scaler) {
        for (int h = 0; h < kNumSizesToTest; ++h) {
          const int src_height = kSizesToTest[h];
          for (int w = 0; w < kNumSizesToTest; ++w) {
            const int src_width = kSizesToTest[w];
            for (int sf_up_idx = 0; sf_up_idx < kNumScaleFactorsToTest;
                 ++sf_up_idx) {
              const int sf_up = kScaleFactors[sf_up_idx];
              for (int sf_down_idx = 0; sf_down_idx < kNumScaleFactorsToTest;
                   ++sf_down_idx) {
                const int sf_down = kScaleFactors[sf_down_idx];
                const int dst_width = src_width * sf_up / sf_down;
                const int dst_height = src_height * sf_up / sf_down;
                // TODO: bug aomedia:363916152 - Enable unit tests for 4 to 3
                // scaling when Neon and SSSE3 implementation of
                // av1_resize_and_extend_frame do not differ from scalar version
                if (sf_down == 4 && sf_up == 3) {
                  continue;
                }

                if (sf_up == sf_down && sf_up != 1) {
                  continue;
                }
                // I420 frame width and height must be even.
                if (!dst_width || !dst_height || dst_width & 1 ||
                    dst_height & 1) {
                  continue;
                }
                // aom_convolve8_c() has restriction on the step which cannot
                // exceed 64 (ratio 1 to 4).
                if (src_width > 4 * dst_width || src_height > 4 * dst_height) {
                  continue;
                }
                ASSERT_NO_FATAL_FAILURE(ResetResizeImages(
                    src_width, src_height, dst_width, dst_height, dst_border));

                av1_resize_and_extend_frame_c(&img_, &ref_img_, filter_type,
                                              phase_scaler, 1);
                resize_fn_(&img_, &dst_img_, filter_type, phase_scaler, 1);

                if (memcmp(dst_img_.buffer_alloc, ref_img_.buffer_alloc,
                           ref_img_.frame_size)) {
                  printf(
                      "filter_type = %d, phase_scaler = %d, src_width = %4d, "
                      "src_height = %4d, dst_width = %4d, dst_height = %4d, "
                      "scale factor = %d:%d\n",
                      filter_type, phase_scaler, src_width, src_height,
                      dst_width, dst_height, sf_down, sf_up);
                  PrintDiff();
                }

                EXPECT_EQ(ref_img_.frame_size, dst_img_.frame_size);
                EXPECT_EQ(0,
                          memcmp(ref_img_.buffer_alloc, dst_img_.buffer_alloc,
                                 ref_img_.frame_size));

                DeallocResizeImages();
              }
            }
          }
        }
      }
    }
  }